

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O0

void anon_unknown.dwarf_1485b::iDrawLine(Vec3 *startPoint,Vec3 *endPoint,Color *color)

{
  PFNGLCOLOR3FPROC p_Var1;
  int in_ECX;
  Color *in_RDX;
  void *extraout_RDX;
  void *in_RSI;
  char *in_R8;
  int in_R9D;
  GLfloat extraout_XMM0_Da;
  float fVar2;
  float fVar3;
  int in_stack_ffffffffffffffc8;
  
  OpenSteer::warnIfInUpdatePhase((char *)0x119b7f);
  p_Var1 = glad_glColor3f;
  OpenSteer::Color::r(in_RDX,in_RSI,extraout_RDX,in_ECX,in_R8,in_R9D,in_stack_ffffffffffffffc8);
  fVar2 = OpenSteer::Color::g(in_RDX);
  fVar3 = OpenSteer::Color::b(in_RDX);
  (*p_Var1)(extraout_XMM0_Da,fVar2,fVar3);
  (*glad_glBegin)(1);
  OpenSteer::glVertexVec3((Vec3 *)0x119be6);
  OpenSteer::glVertexVec3((Vec3 *)0x119bf0);
  (*glad_glEnd)();
  return;
}

Assistant:

inline void iDrawLine (const OpenSteer::Vec3& startPoint,
                           const OpenSteer::Vec3& endPoint,
                           const OpenSteer::Color& color)
    {
        OpenSteer::warnIfInUpdatePhase ("iDrawLine");
        glColor3f (color.r(), color.g(), color.b());
        glBegin (GL_LINES);
        glVertexVec3 (startPoint);
        glVertexVec3 (endPoint);
        glEnd ();
    }